

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O3

int __thiscall
FFlatVertexBuffer::CreateSubsectorVertices
          (FFlatVertexBuffer *this,subsector_t *sub,secplane_t *plane,int floor)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  seg_t *psVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  FFlatVertex *pFVar12;
  long lVar13;
  float fVar14;
  
  uVar4 = sub->numlines;
  TArray<FFlatVertex,_FFlatVertex>::Grow(&this->vbo_shadowdata,uVar4);
  uVar11 = (this->vbo_shadowdata).Count;
  (this->vbo_shadowdata).Count = uVar4 + uVar11;
  uVar4 = sub->numlines;
  if ((ulong)uVar4 != 0) {
    psVar5 = sub->firstline;
    dVar1 = plane->D;
    dVar7 = (plane->normal).X;
    dVar8 = (plane->normal).Y;
    dVar2 = plane->negiC;
    bVar3 = sub->sector->transdoor;
    pFVar12 = (this->vbo_shadowdata).Array + (int)uVar11;
    uVar11 = uVar11 + uVar4;
    lVar13 = 0;
    do {
      pdVar6 = *(double **)((long)&psVar5->v1 + lVar13);
      dVar9 = *pdVar6;
      dVar10 = pdVar6[1];
      fVar14 = (float)((dVar8 * dVar10 + dVar7 * dVar9 + dVar1) * dVar2);
      pFVar12->x = (float)dVar9;
      pFVar12->z = fVar14;
      pFVar12->y = (float)dVar10;
      pFVar12->u = (float)(dVar9 * 0.015625);
      pFVar12->v = (float)(dVar10 * -0.015625);
      if ((floor != 0 & bVar3) != 0) {
        pFVar12->z = fVar14 + -1.0;
      }
      pFVar12 = pFVar12 + 1;
      lVar13 = lVar13 + 0x48;
    } while ((ulong)uVar4 * 0x48 != lVar13);
  }
  return uVar11;
}

Assistant:

int FFlatVertexBuffer::CreateSubsectorVertices(subsector_t *sub, const secplane_t &plane, int floor)
{
	int idx = vbo_shadowdata.Reserve(sub->numlines);
	for(unsigned int k=0; k<sub->numlines; k++, idx++)
	{
		vbo_shadowdata[idx].SetFlatVertex(sub->firstline[k].v1, plane);
		if (sub->sector->transdoor && floor) vbo_shadowdata[idx].z -= 1.f;
	}
	return idx;
}